

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

HANDLE OpenFileMappingA(DWORD dwDesiredAccess,BOOL bInheritHandle,LPCSTR lpName)

{
  DWORD local_2c;
  PAL_ERROR palError;
  CPalThread *pThread;
  HANDLE hFileMapping;
  LPCSTR lpName_local;
  BOOL bInheritHandle_local;
  DWORD dwDesiredAccess_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  CorUnix::InternalGetCurrentThread();
  if (lpName == (LPCSTR)0x0) {
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
      abort();
    }
    local_2c = 0x57;
  }
  else {
    fprintf(_stderr,"] %s %s:%d","OpenFileMappingA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x31d);
    fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
    local_2c = 0x32;
  }
  if (local_2c != 0) {
    CorUnix::CPalThread::SetLastError(local_2c);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return (HANDLE)0x0;
  }
  abort();
}

Assistant:

HANDLE
PALAPI
OpenFileMappingA(
         IN DWORD dwDesiredAccess,
         IN BOOL bInheritHandle,
         IN LPCSTR lpName)
{
    HANDLE hFileMapping = NULL;
    CPalThread *pThread = NULL;
    PAL_ERROR palError = NO_ERROR;

    PERF_ENTRY(OpenFileMappingA);
    ENTRY("OpenFileMappingA(dwDesiredAccess=%u, bInheritHandle=%d, lpName=%p (%s)\n",
          dwDesiredAccess, bInheritHandle, lpName?lpName:"NULL", lpName?lpName:"NULL");

    pThread = InternalGetCurrentThread();

    if (lpName == nullptr)
    {
        ERROR("name is NULL\n");
        palError = ERROR_INVALID_PARAMETER;
    }
    else
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }

    if (NO_ERROR != palError)
    {
        pThread->SetLastError(palError);
    }
    LOGEXIT( "OpenFileMappingA returning %p\n", hFileMapping );
    PERF_EXIT(OpenFileMappingA);
    return hFileMapping;
}